

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

bool_t bf_put_float32_be(bfile_t *bfile,float32_t value)

{
  bf_put_uint8(bfile,(uint8_t)((uint)value >> 0x18));
  bf_put_uint8(bfile,(uint8_t)((uint)value >> 0x10));
  bf_put_uint8(bfile,(uint8_t)((uint)value >> 8));
  bf_put_uint8(bfile,SUB41(value,0));
  return 1;
}

Assistant:

bool_t
bf_put_float32_be(
    bfile_t * bfile,
    float32_t value )
{
    union {
        float32_t real;
        uint8_t   bytes[4];
    } data;

    assert( bfile != NULL );
    data.real = value;

#ifndef WORDS_BIGENDIAN
    bf_put_uint8( bfile, data.bytes[3] );
    bf_put_uint8( bfile, data.bytes[2] );
    bf_put_uint8( bfile, data.bytes[1] );
    bf_put_uint8( bfile, data.bytes[0] );
#else /* WORDS_BIGENDIAN */
    bf_put_uint8( bfile, data.bytes[0] );
    bf_put_uint8( bfile, data.bytes[1] );
    bf_put_uint8( bfile, data.bytes[2] );
    bf_put_uint8( bfile, data.bytes[3] );
#endif /* WORDS_BIGENDIAN */

    return TRUE;
}